

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

void merge_lcp_2way<false>
               (uchar **from0,lcp_t *lcp_input0,size_t n0,uchar **from1,lcp_t *lcp_input1,size_t n1,
               uchar **result,lcp_t *lcp_result)

{
  char *__s2;
  uchar *__s1;
  lcp_t lVar1;
  int iVar2;
  ostream *poVar3;
  uchar **ppuVar4;
  ulong uVar5;
  long lVar6;
  uchar **local_68;
  lcp_t *local_60;
  ulong local_58;
  size_t local_50;
  lcp_t *local_48;
  uchar local_40;
  undefined7 uStack_3f;
  int local_38;
  
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"merge_lcp_2way",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(): n0=",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", n1=",5);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  local_40 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_40,1);
  compare(&local_40,*from0,(size_t)*from1);
  ppuVar4 = result + 1;
  if (0 < local_38) {
    *result = *from1;
    n1 = n1 - 1;
    local_68 = from0;
    if (n1 != 0) {
      from1 = from1 + 1;
      local_60 = lcp_input1 + 1;
      lVar1 = *lcp_input1;
      local_58 = CONCAT71(uStack_3f,local_40);
      local_48 = lcp_input0;
      local_50 = n0;
      goto LAB_00236742;
    }
LAB_002368c7:
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    local_40 = '~';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_40,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"merge_lcp_2way",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(): n0=",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", n1=",5);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    local_40 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_40,1);
    from1 = local_68;
    local_68 = ppuVar4;
    if (n0 == 0) {
      __assert_fail("n0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0xce,
                    "void merge_lcp_2way(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                   );
    }
    goto LAB_0023697e;
  }
  *result = *from0;
  local_50 = n0 - 1;
  local_68 = ppuVar4;
  if (local_50 != 0) {
    local_68 = from0 + 1;
    local_58 = *lcp_input0;
    local_48 = lcp_input0 + 1;
    lVar1 = CONCAT71(uStack_3f,local_40);
    local_60 = lcp_input1;
LAB_00236742:
    do {
      uVar5 = lVar1;
      lVar6 = 0;
      while (local_58 <= uVar5) {
        n0 = local_50;
        if (uVar5 <= local_58) {
          compare(&local_40,*local_68,*(size_t *)((long)from1 + lVar6));
          uVar5 = CONCAT71(uStack_3f,local_40);
          if (local_38 < 1) {
            *(uchar **)((long)ppuVar4 + lVar6) = *local_68;
            if (local_50 != 1) goto LAB_00236862;
            goto LAB_00236a54;
          }
          *(undefined8 *)(lVar6 + (long)ppuVar4) = *(undefined8 *)((long)from1 + lVar6);
          if (n1 != 1) {
            ppuVar4 = (uchar **)((long)ppuVar4 + lVar6 + 8);
            n1 = n1 - 1;
            from1 = (uchar **)((long)from1 + lVar6 + 8);
            local_60 = (lcp_t *)((long)local_60 + lVar6 + 8);
            lVar1 = local_60[-1];
            local_58 = uVar5;
            goto LAB_00236742;
          }
          ppuVar4 = (uchar **)((long)ppuVar4 + lVar6 + 8);
          goto LAB_002368c7;
        }
        if (*local_68 == (uchar *)0x0) goto LAB_00236a76;
        __s2 = *(char **)((long)from1 + lVar6);
        if (__s2 == (char *)0x0) goto LAB_00236a95;
        iVar2 = strcmp((char *)*local_68,__s2);
        if (iVar2 < 1) {
          __assert_fail("cmp(*from0, *from1) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0xad,
                        "void merge_lcp_2way(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                       );
        }
        *(char **)((long)ppuVar4 + lVar6) = __s2;
        uVar5 = *(ulong *)((long)local_60 + lVar6);
        lVar6 = lVar6 + 8;
        n1 = n1 - 1;
        if (n1 == 0) {
          ppuVar4 = (uchar **)((long)ppuVar4 + lVar6);
          goto LAB_002368c7;
        }
      }
      __s1 = *local_68;
      if (__s1 == (uchar *)0x0) {
LAB_00236a76:
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
      }
      if (*(char **)((long)from1 + lVar6) == (char *)0x0) {
LAB_00236a95:
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar2 = strcmp((char *)__s1,*(char **)((long)from1 + lVar6));
      if (-1 < iVar2) {
        __assert_fail("cmp(*from0, *from1) < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0xa7,
                      "void merge_lcp_2way(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                     );
      }
      *(uchar **)((long)ppuVar4 + lVar6) = __s1;
      if (local_50 == 1) goto LAB_00236a54;
LAB_00236862:
      local_50 = local_50 - 1;
      ppuVar4 = (uchar **)((long)ppuVar4 + lVar6 + 8);
      local_58 = *local_48;
      local_68 = local_68 + 1;
      local_48 = local_48 + 1;
      from1 = (uchar **)((long)from1 + lVar6);
      local_60 = (lcp_t *)((long)local_60 + lVar6);
      lVar1 = uVar5;
    } while( true );
  }
  goto LAB_00236996;
LAB_00236a54:
  from1 = (uchar **)((long)from1 + lVar6);
  local_68 = (uchar **)((long)ppuVar4 + lVar6 + 8);
LAB_00236996:
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  local_40 = '~';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_40,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"merge_lcp_2way",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(): n0=",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", n1=",5);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  local_40 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_40,1);
  n0 = n1;
  if (n1 == 0) {
    __assert_fail("n1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0xc6,
                  "void merge_lcp_2way(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                 );
  }
LAB_0023697e:
  memmove(local_68,from1,n0 << 3);
  return;
}

Assistant:

static void
merge_lcp_2way(unsigned char** from0,  lcp_t* restrict lcp_input0, size_t n0,
               unsigned char** from1,  lcp_t* restrict lcp_input1, size_t n1,
               unsigned char** result, lcp_t* restrict lcp_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	lcp_t lcp0=0, lcp1=0;
	{
		int cmp01; lcp_t lcp01;
		std::tie(cmp01, lcp01) = compare(*from0, *from1);
		if (cmp01 <= 0) {
			*result++ = *from0++;
			lcp0 = *lcp_input0++;
			lcp1 = lcp01;
			if (--n0 == 0) goto finish0;
		} else {
			*result++ = *from1++;
			lcp1 = *lcp_input1++;
			lcp0 = lcp01;
			if (--n1 == 0) goto finish1;
		}
	}
	while (true) {
		/*
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
		        << "\tprev  = '"<<*(result-1)<<"'\n"
		        << "\tfrom0 = '"<<*from0<<"'\n"
		        << "\tfrom1 = '"<<*from1<<"'\n"
		        << "\tlcp0  = " << lcp0 << "\n"
		        << "\tlcp1  = " << lcp1 << "\n"
		        << "\n";
		*/
		if (lcp0 > lcp1) {
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			lcp0 = *lcp_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			lcp1 = *lcp_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			int cmp01; lcp_t lcp01;
			std::tie(cmp01,lcp01) = compare(*from0, *from1, lcp0);
			if (OutputLCP) *lcp_result++ = lcp0;
			if (cmp01 <= 0) {
				*result++ = *from0++;
				lcp1 = lcp01;
				if (--n0 == 0) goto finish0;
				lcp0 = *lcp_input0++;
			} else {
				*result++ = *from1++;
				lcp0 = lcp01;
				if (--n1 == 0) goto finish1;
				lcp1 = *lcp_input1++;
			}
		}
	}
finish0:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n0);
	assert(n1);
	std::copy(from1, from1+n1, result);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	return;
finish1:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n1);
	assert(n0);
	std::copy(from0, from0+n0, result);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	return;
}